

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_print.c
# Opt level: O3

int table_print_level(void *cptr,mpt_identifier *id,mpt_convertable *conv,mpt_collection *sub)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 *puVar4;
  char *str;
  char *local_40;
  FILE *local_38;
  
  __stream = *(FILE **)((long)cptr + 8);
  for (puVar4 = *cptr; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
    fputc(0x2e,__stream);
  }
  if (id != (mpt_identifier *)0x0) {
    pcVar3 = (char *)mpt_identifier_data(id);
    fputs(pcVar3,__stream);
  }
  if (conv != (mpt_convertable *)0x0) {
    local_40 = (char *)0x0;
    fputc(0x3d,__stream);
    iVar1 = (*conv->_vptr->convert)(conv,0x73,&local_40);
    if (local_40 != (char *)0x0 && -1 < iVar1) {
      fputs(local_40,__stream);
    }
  }
  pcVar3 = (char *)mpt_newline_string(0);
  fputs(pcVar3,__stream);
  iVar1 = 0;
  if (sub != (mpt_collection *)0x0) {
    local_40 = (char *)cptr;
    local_38 = __stream;
    iVar2 = (*sub->_vptr->each)(sub,table_print_level,&local_40);
    iVar1 = 0;
    if (iVar2 < 0) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

extern int table_print_level(void *cptr, const MPT_STRUCT(identifier) *id, MPT_INTERFACE(convertable) *conv, const MPT_INTERFACE(collection) *sub)
{
	
	const struct print_context *ctx = cptr, *parent;
	FILE *file = ctx->out;
	
	/* print leading dots to indicate element depth */
	while ((parent = ctx->parent)) {
		fputc('.', file);
		ctx = parent;
	}
	
	/* current identifier and value */
	if (id) {
		const char *str = mpt_identifier_data(id);
		fputs(str, file);
	}
	if (conv) {
		const char *str = 0;
		fputc('=', file);
		if (conv->_vptr->convert(conv, 's', &str) >= 0 && str) {
			fputs(str, file);
		}
	}
	fputs(mpt_newline_string(0), file);
	
	/* process subtree with increased depth */
	if (sub) {
		struct print_context next = { cptr, file };
		int ret = sub->_vptr->each(sub, table_print_level, &next);
		
		if (ret < 0) {
			return ret;
		}
	}
	
	return 0;
}